

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

unique_ptr<JsonMap,_std::default_delete<JsonMap>_> __thiscall
MPL::detail::ModelPackageImpl::getItemInfoEntries(ModelPackageImpl *this)

{
  JsonMap *this_00;
  string *key;
  bool bVar1;
  long in_RSI;
  allocator<char> local_41;
  string local_40;
  
  this_00 = *(JsonMap **)(in_RSI + 0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"itemInfoEntries",&local_41);
  bVar1 = JsonMap::hasKey(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    key = *(string **)(in_RSI + 0x78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"itemInfoEntries",&local_41);
    JsonMap::getObject((JsonMap *)this,key);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::make_unique<JsonMap>();
  }
  return (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)
         (__uniq_ptr_data<JsonMap,_std::default_delete<JsonMap>,_true,_true>)this;
}

Assistant:

std::unique_ptr<JsonMap> ModelPackageImpl::getItemInfoEntries() const
{
    if (m_manifest->hasKey(kModelPackageItemInfoEntriesKey)) {
        return m_manifest->getObject(kModelPackageItemInfoEntriesKey);
    }

    return std::make_unique<JsonMap>();
}